

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPolicies.cxx
# Opt level: O0

bool stringToId(char *input,PolicyID *pid)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  long local_30;
  long id;
  PolicyID *pPStack_20;
  int i;
  PolicyID *pid_local;
  char *input_local;
  
  pPStack_20 = pid;
  pid_local = (PolicyID *)input;
  if (input == (char *)0x0) {
    __assert_fail("input",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmPolicies.cxx"
                  ,0xe,"bool stringToId(const char *, cmPolicies::PolicyID &)");
  }
  sVar3 = strlen(input);
  if (sVar3 == 7) {
    bVar1 = cmHasLiteralPrefix<char_const*,4ul>((char *)pid_local,(char (*) [4])"CMP");
    if (bVar1) {
      bVar1 = cmHasLiteralSuffix<char_const*,5ul>((char *)pid_local,(char (*) [5])0x8f1d0b);
      if (bVar1) {
        *pPStack_20 = CMP0000;
        input_local._7_1_ = true;
      }
      else {
        for (id._4_4_ = 3; id._4_4_ < 7; id._4_4_ = id._4_4_ + 1) {
          iVar2 = isdigit((int)*(char *)((long)pid_local + (long)id._4_4_));
          if (iVar2 == 0) {
            return false;
          }
        }
        bVar1 = cmSystemTools::StringToLong((char *)((long)pid_local + 3),&local_30);
        if (bVar1) {
          if (local_30 < 0x40) {
            *pPStack_20 = (PolicyID)local_30;
            input_local._7_1_ = true;
          }
          else {
            input_local._7_1_ = false;
          }
        }
        else {
          input_local._7_1_ = false;
        }
      }
    }
    else {
      input_local._7_1_ = false;
    }
  }
  else {
    input_local._7_1_ = false;
  }
  return input_local._7_1_;
}

Assistant:

static bool stringToId(const char* input, cmPolicies::PolicyID& pid)
{
  assert(input);
  if (strlen(input) != 7)
    {
    return false;
    }
  if (!cmHasLiteralPrefix(input, "CMP"))
    {
    return false;
    }
  if (cmHasLiteralSuffix(input, "0000"))
    {
    pid = cmPolicies::CMP0000;
    return true;
    }
  for (int i = 3; i < 7; ++i)
    {
    if (!isdigit(*(input + i)))
      {
      return false;
      }
    }
  long id;
  if (!cmSystemTools::StringToLong(input + 3, &id))
    {
    return false;
    }
  if (id >= cmPolicies::CMPCOUNT)
    {
    return false;
    }
  pid = cmPolicies::PolicyID(id);
  return true;
}